

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O0

void __thiscall TPZReducedSpace::InitializeElementMatrix(TPZReducedSpace *this,TPZElementMatrix *ef)

{
  int iVar1;
  int iVar2;
  int num_of_blocks;
  undefined8 uVar3;
  long *plVar4;
  TPZCompMesh *pTVar5;
  TPZConnect *this_00;
  long lVar6;
  long *in_RSI;
  anon_class_8_1_ba1d60c0 *in_RDI;
  uint nshape_1;
  int i;
  int numloadcases;
  int numeq;
  int nshape;
  int ncon;
  int numdof;
  TPZMaterial *mat;
  TPZCompEl *in_stack_00000190;
  int local_3c;
  int in_stack_ffffffffffffffd0;
  int iVar7;
  undefined4 uVar8;
  
  uVar3 = (**(code **)&in_RDI->mat[7].fId)();
  uVar8 = 1;
  iVar1 = (**(code **)(in_RDI->mat + 6))();
  iVar2 = (**(code **)(in_RDI->mat + 0x19))();
  iVar7 = iVar2;
  num_of_blocks = InitializeElementMatrix::anon_class_8_1_ba1d60c0::operator()(in_RDI);
  plVar4 = (long *)(**(code **)(*in_RSI + 0x40))();
  (**(code **)(*plVar4 + 0x70))(plVar4,(long)iVar2,(long)num_of_blocks);
  (**(code **)(*in_RSI + 0x50))();
  TPZBlock::SetNBlocks((TPZBlock *)CONCAT44(iVar7,iVar2),num_of_blocks);
  pTVar5 = TPZCompEl::Mesh(in_stack_00000190);
  in_RSI[2] = (long)pTVar5;
  *(undefined4 *)(in_RSI + 1) = 1;
  for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
    this_00 = (TPZConnect *)(**(code **)(in_RDI->mat + 7))(in_RDI,local_3c);
    TPZConnect::NShape(this_00);
    (**(code **)(*in_RSI + 0x50))();
    TPZBlock::Set((TPZBlock *)CONCAT44(iVar7,iVar2),num_of_blocks,in_stack_ffffffffffffffd0,
                  (int)((ulong)uVar3 >> 0x20));
  }
  TPZManVector<long,_10>::Resize
            ((TPZManVector<long,_10> *)CONCAT44(uVar8,iVar1),CONCAT44(iVar7,iVar2));
  for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
    lVar6 = (**(code **)&in_RDI->mat[6].fId)(in_RDI,local_3c);
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RSI + 3),(long)local_3c);
    *plVar4 = lVar6;
  }
  return;
}

Assistant:

void TPZReducedSpace::InitializeElementMatrix(TPZElementMatrix &ef)
{
    TPZMaterial *mat = this->Material();
	const int numdof = 1;
	const int ncon = this->NConnects();
#ifdef PZDEBUG
    if (ncon != 1) {
        DebugStop();
    }
#endif
	const int nshape = this->NShapeF();
	const int numeq = nshape*numdof;
    const int numloadcases = [mat](){
        if (auto *tmp = dynamic_cast<TPZMatLoadCasesBase*>(mat); tmp){
            return tmp->NumLoadCases();
        }else{
            return 1;
        }
    }();
	ef.Matrix().Redim(numeq,numloadcases);
	ef.Block().SetNBlocks(ncon);
    ef.fMesh = Mesh();
    ef.fType = TPZElementMatrix::EF;
	int i;
	for(i=0; i<ncon; i++){
        unsigned int nshape = Connect(i).NShape();
		ef.Block().Set(i,nshape*numdof);
	}
	ef.fConnect.Resize(ncon);
	for(i=0; i<ncon; i++){
		(ef.fConnect)[i] = ConnectIndex(i);
	}    
}